

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

int ON_EarthAnchorPoint::CompareModelDirection(ON_EarthAnchorPoint *a,ON_EarthAnchorPoint *b)

{
  int iVar1;
  
  if (a == (ON_EarthAnchorPoint *)0x0) {
    iVar1 = -(uint)(b != (ON_EarthAnchorPoint *)0x0);
  }
  else if (b == (ON_EarthAnchorPoint *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = ON_ComparePoint(3,false,&(a->m_model_point).x,&(b->m_model_point).x);
    if (iVar1 == 0) {
      iVar1 = ON_ComparePoint(3,false,&(a->m_model_north).x,&(b->m_model_north).x);
      if (iVar1 == 0) {
        iVar1 = ON_ComparePoint(3,false,&(a->m_model_east).x,&(b->m_model_east).x);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int ON_EarthAnchorPoint::CompareModelDirection(const ON_EarthAnchorPoint* a, const ON_EarthAnchorPoint* b)
{
  if ( !a )
  {
    return b ? -1 : 0;
  }
  if (!b)
  {
    return 1;
  }

  int i = ON_ComparePoint(3,false,&a->m_model_point.x,&b->m_model_point.x);
  if ( !i )
  {
    i = ON_ComparePoint(3,false,&a->m_model_north.x,&b->m_model_north.x);
    if ( !i )
    {
      i = ON_ComparePoint(3,false,&a->m_model_east.x,&b->m_model_east.x);
    }
  }
  return i;  
}